

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

_Bool av1_add_to_hash_map_by_row_with_precal_data
                (hash_table *p_hash_table,uint32_t **pic_hash,int8_t *pic_is_same,int pic_width,
                int pic_height,int block_size)

{
  int iVar1;
  int iVar2;
  Vector *pVVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int y_pos;
  long lVar7;
  block_hash curr_block_hash;
  uint32_t *local_50;
  uint32_t *local_48;
  int8_t *local_40;
  
  local_48 = *pic_hash;
  local_50 = pic_hash[1];
  iVar1 = hash_block_size_to_index(block_size);
  local_40 = pic_is_same;
  for (lVar4 = 0; lVar4 <= pic_width - block_size; lVar4 = lVar4 + 1) {
    lVar6 = 0;
    for (lVar7 = 0; lVar7 <= pic_height - block_size; lVar7 = lVar7 + 1) {
      if (local_40[lVar6] != '\0') {
        curr_block_hash.x = (int16_t)lVar4;
        curr_block_hash.y = (int16_t)lVar7;
        uVar5 = (uint)(ushort)local_48[lVar6] | iVar1 << 0x10;
        curr_block_hash.hash_value2 = local_50[lVar6];
        pVVar3 = p_hash_table->p_lookup_table[uVar5];
        if (pVVar3 == (Vector *)0x0) {
          pVVar3 = (Vector *)aom_malloc(0x20);
          p_hash_table->p_lookup_table[uVar5] = pVVar3;
          if ((p_hash_table->p_lookup_table[uVar5] == (Vector *)0x0) ||
             (iVar2 = aom_vector_setup(p_hash_table->p_lookup_table[uVar5],10,8), iVar2 == -1))
          goto LAB_001bb7b5;
          pVVar3 = p_hash_table->p_lookup_table[uVar5];
        }
        iVar2 = aom_vector_push_back(pVVar3,&curr_block_hash);
        if (iVar2 == -1) goto LAB_001bb7b5;
      }
      lVar6 = lVar6 + pic_width;
    }
    local_40 = local_40 + 1;
    local_48 = local_48 + 1;
    local_50 = local_50 + 1;
  }
LAB_001bb7b5:
  return pic_width - block_size < lVar4;
}

Assistant:

bool av1_add_to_hash_map_by_row_with_precal_data(hash_table *p_hash_table,
                                                 uint32_t *pic_hash[2],
                                                 int8_t *pic_is_same,
                                                 int pic_width, int pic_height,
                                                 int block_size) {
  const int x_end = pic_width - block_size + 1;
  const int y_end = pic_height - block_size + 1;

  const int8_t *src_is_added = pic_is_same;
  const uint32_t *src_hash[2] = { pic_hash[0], pic_hash[1] };

  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  for (int x_pos = 0; x_pos < x_end; x_pos++) {
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      const int pos = y_pos * pic_width + x_pos;
      // valid data
      if (src_is_added[pos]) {
        block_hash curr_block_hash;
        curr_block_hash.x = x_pos;
        curr_block_hash.y = y_pos;

        const uint32_t hash_value1 = (src_hash[0][pos] & crc_mask) + add_value;
        curr_block_hash.hash_value2 = src_hash[1][pos];

        if (!hash_table_add_to_table(p_hash_table, hash_value1,
                                     &curr_block_hash)) {
          return false;
        }
      }
    }
  }
  return true;
}